

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O1

void alGetDoublev(ALenum param,ALdouble *values)

{
  APILOCK();
  IO_ENTRYINFO(ALEE_alGetDoublev);
  writele32(param);
  IO_UINT64((uint64)values);
  (*REAL_alGetDoublev)(param,values);
  writele32(0);
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alGetDoublev(ALenum param, ALdouble *values)
{
    uint32 numvals = 0;
    uint32 i;
    IO_START(alGetDoublev);
    IO_ENUM(param);
    IO_PTR(values);
    // nothing in AL 1.1 uses this.
    if (!values) { numvals = 0; }
    if (numvals) {
        memset(values, '\0', numvals * sizeof (ALdouble));
    }
    REAL_alGetDoublev(param, values);
    IO_UINT32(numvals);
    for (i = 0; i < numvals; i++) {
        IO_DOUBLE(values[i]);
    }
    IO_END();
}